

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printUTCTime(PrettyPrinter *this,OstreamBuffer *out,uint64_t clockValue)

{
  long in_RDI;
  nanoseconds sinceEpoch;
  BrokenDownTime bdt;
  char *in_stack_ffffffffffffff98;
  OstreamBuffer *in_stack_ffffffffffffffa0;
  ClockSync *in_stack_ffffffffffffffa8;
  nanoseconds in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  BrokenDownTime *in_stack_ffffffffffffffc0;
  OstreamBuffer *in_stack_ffffffffffffffc8;
  PrettyPrinter *in_stack_ffffffffffffffd0;
  
  if (*(long *)(*(long *)(in_RDI + 0x48) + 8) < 1) {
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    memset(&stack0xffffffffffffffa8,0,0x40);
    clockToNsSinceEpoch(in_stack_ffffffffffffffa8,(uint64_t)in_stack_ffffffffffffffa0);
    nsSinceEpochToBrokenDownTimeUTC
              (in_stack_ffffffffffffffb0,(BrokenDownTime *)in_stack_ffffffffffffffa8);
    printTime(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
              in_stack_ffffffffffffffbc,(char *)in_stack_ffffffffffffffb0.__r);
  }
  return;
}

Assistant:

void PrettyPrinter::printUTCTime(detail::OstreamBuffer& out, std::uint64_t clockValue) const
{
  // TODO(benedek) perf: cache bdt, update instead of complete recompute

  if (std::int64_t(_clockSync->clockFrequency) > 0)
  {
    BrokenDownTime bdt{};
    const std::chrono::nanoseconds sinceEpoch = clockToNsSinceEpoch(*_clockSync, clockValue);
    nsSinceEpochToBrokenDownTimeUTC(sinceEpoch, bdt);
    printTime(out, bdt, 0, "UTC");
  }
  else
  {
    out << "no_clock_sync?";
  }
}